

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int __thiscall ncnn::UnaryOp::forward_inplace(UnaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  int __rounding_direction;
  Option *in_RDI;
  int ret;
  int old_rm;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*(int *)&in_RDI[3].workspace_allocator == 0) {
    local_4 = unary_op_inplace<ncnn::unary_op_abs>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 1) {
    local_4 = unary_op_inplace<ncnn::unary_op_neg>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 2) {
    local_4 = unary_op_inplace<ncnn::unary_op_floor>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 3) {
    local_4 = unary_op_inplace<ncnn::unary_op_ceil>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 4) {
    local_4 = unary_op_inplace<ncnn::unary_op_square>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 5) {
    local_4 = unary_op_inplace<ncnn::unary_op_sqrt>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 6) {
    local_4 = unary_op_inplace<ncnn::unary_op_rsqrt>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 7) {
    local_4 = unary_op_inplace<ncnn::unary_op_exp>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 8) {
    local_4 = unary_op_inplace<ncnn::unary_op_log>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 9) {
    local_4 = unary_op_inplace<ncnn::unary_op_sin>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 10) {
    local_4 = unary_op_inplace<ncnn::unary_op_cos>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0xb) {
    local_4 = unary_op_inplace<ncnn::unary_op_tan>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0xc) {
    local_4 = unary_op_inplace<ncnn::unary_op_asin>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0xd) {
    local_4 = unary_op_inplace<ncnn::unary_op_acos>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0xe) {
    local_4 = unary_op_inplace<ncnn::unary_op_atan>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0xf) {
    local_4 = unary_op_inplace<ncnn::unary_op_reciprocal>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0x10) {
    local_4 = unary_op_inplace<ncnn::unary_op_tanh>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0x11) {
    local_4 = unary_op_inplace<ncnn::unary_op_log10>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0x12) {
    __rounding_direction = fegetround();
    fesetround(0);
    local_4 = unary_op_inplace<ncnn::unary_op_round>
                        ((Mat *)CONCAT44(__rounding_direction,in_stack_ffffffffffffffd8),in_RDI);
    fesetround(__rounding_direction);
  }
  else if (*(int *)&in_RDI[3].workspace_allocator == 0x13) {
    local_4 = unary_op_inplace<ncnn::unary_op_trunc>
                        ((Mat *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                        );
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int UnaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}